

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_ID_REQ.cpp
# Opt level: O0

bool __thiscall
SRUP_MSG_SYNDICATED_ID_REQ::DeSerialize(SRUP_MSG_SYNDICATED_ID_REQ *this,uint8_t *serial_data)

{
  uint16_t uVar1;
  uint64_t *puVar2;
  uint8_t *puVar3;
  uchar *tgt_byte;
  uint8_t *__end1_2;
  uint8_t *__begin1_2;
  uint8_t (*__range1_2) [8];
  uint8_t tgt_bytes [8];
  uchar *snd_byte;
  uint8_t *__end1_1;
  uint8_t *__begin1_1;
  uint8_t (*__range1_1) [8];
  uint8_t snd_bytes [8];
  uchar *sid_byte;
  uint8_t *__end1;
  uint8_t *__begin1;
  uint8_t (*__range1) [8];
  uint8_t sid_bytes [8];
  uint8_t bytes [2];
  uint32_t p;
  uint16_t x;
  uint8_t *serial_data_local;
  SRUP_MSG_SYNDICATED_ID_REQ *this_local;
  
  *(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_msgtype = serial_data[1];
  sid_bytes[2] = '\x02';
  sid_bytes[3] = '\0';
  sid_bytes[4] = '\0';
  sid_bytes[5] = '\0';
  for (__end1 = (uint8_t *)((long)&__range1 + 6); __end1 != sid_bytes; __end1 = __end1 + 1) {
    snd_bytes = (uint8_t  [8])__end1;
    *__end1 = serial_data[(uint)sid_bytes._2_4_];
    sid_bytes._2_4_ = sid_bytes._2_4_ + 1;
  }
  if (((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sequence_ID !=
       (uint64_t *)0x0) &&
     (puVar2 = (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sequence_ID,
     puVar2 != (uint64_t *)0x0)) {
    operator_delete(puVar2);
  }
  puVar2 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sequence_ID = puVar2;
  *(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sequence_ID =
       stack0xffffffffffffffd6;
  for (__end1_1 = (uint8_t *)&__range1_1; __end1_1 != snd_bytes; __end1_1 = __end1_1 + 1) {
    tgt_bytes = (uint8_t  [8])__end1_1;
    *__end1_1 = serial_data[(uint)sid_bytes._2_4_];
    sid_bytes._2_4_ = sid_bytes._2_4_ + 1;
  }
  puVar2 = (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sender_ID;
  if (puVar2 != (uint64_t *)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sender_ID = puVar2;
  *(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sender_ID =
       (uint64_t)__range1_1;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  puVar3 = (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token;
  if (puVar3 != (uint8_t *)0x0) {
    operator_delete__(puVar3);
  }
  puVar3 = (uint8_t *)operator_new__((long)(int)(uVar1 + 1));
  (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token = puVar3;
  memcpy((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token,
         serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token_len = uVar1;
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sig_len = uVar1;
  puVar3 = (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_signature;
  if (puVar3 != (uint8_t *)0x0) {
    operator_delete__(puVar3);
  }
  puVar3 = (uint8_t *)operator_new__((ulong)uVar1);
  (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_signature = puVar3;
  memcpy((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_signature,
         serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  for (__end1_2 = (uint8_t *)&__range1_2; __end1_2 != tgt_bytes; __end1_2 = __end1_2 + 1) {
    *__end1_2 = serial_data[(uint)sid_bytes._2_4_];
    sid_bytes._2_4_ = sid_bytes._2_4_ + 1;
  }
  if (this->m_target_ID != (uint64_t *)0x0) {
    operator_delete(this->m_target_ID);
  }
  puVar2 = (uint64_t *)operator_new(8);
  this->m_target_ID = puVar2;
  *this->m_target_ID = (uint64_t)__range1_2;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_ID_REQ::DeSerialize (const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Next we have to unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the sender ID
    delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new uint8_t[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Finally we unmarshall the target ID...
    uint8_t tgt_bytes[8];
    for (unsigned char & tgt_byte : tgt_bytes)
    {
        std::memcpy(&tgt_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the target ID
    delete(m_target_ID);
    m_target_ID = new uint64_t;
    std::memcpy(m_target_ID, tgt_bytes, 8);

    return true;
}